

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O3

void __thiscall polyscope::SlicePlane::setPose(SlicePlane *this,vec3 planePosition,vec3 planeNormal)

{
  ulong uVar1;
  ulong uVar2;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar3;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar4;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar5;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar6;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar7;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar8;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar9;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar10;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar11;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar12;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar13;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar14;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar15;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar16;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar17;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar18;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar19;
  mapped_type *pmVar20;
  undefined1 auVar21 [64];
  float in_XMM2_Dd;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  
  aVar22 = planeNormal.field_2;
  auVar21._8_56_ = planePosition._8_56_;
  auVar21._0_8_ = planePosition._0_8_;
  aVar3 = planeNormal.field_0;
  auVar25._0_4_ = aVar3.x * aVar3.x;
  aVar4 = planeNormal.field_1;
  auVar25._4_4_ = aVar4.y * aVar4.y;
  auVar25._8_4_ = 0;
  auVar25._12_4_ = in_XMM2_Dd * in_XMM2_Dd;
  fVar23 = (this->objectTransform).value.value[1].field_2.z;
  auVar25 = vhaddps_avx(auVar25,auVar25);
  auVar25 = ZEXT416((uint)(aVar22.z * aVar22.z + auVar25._0_4_));
  auVar25 = vsqrtss_avx(auVar25,auVar25);
  fVar28 = 1.0 / auVar25._0_4_;
  auVar26._0_4_ = fVar28 * aVar3.x;
  auVar26._4_4_ = fVar28 * aVar4.y;
  auVar26._8_4_ = fVar28 * 0.0;
  auVar26._12_4_ = fVar28 * in_XMM2_Dd;
  fVar28 = fVar28 * aVar22.z;
  uVar1._0_4_ = (this->objectTransform).value.value[1].field_0;
  uVar1._4_4_ = (this->objectTransform).value.value[1].field_1;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar1;
  auVar30._0_4_ = auVar26._0_4_ * (float)(undefined4)uVar1;
  auVar30._4_4_ = auVar26._4_4_ * (float)uVar1._4_4_;
  auVar30._8_4_ = auVar26._8_4_ * 0.0;
  auVar30._12_4_ = auVar26._12_4_ * 0.0;
  auVar25 = vhaddps_avx(auVar30,auVar30);
  fVar27 = fVar28 * fVar23 + auVar25._0_4_;
  auVar32._0_4_ = fVar27 * auVar26._0_4_;
  auVar32._4_4_ = fVar27 * auVar26._4_4_;
  auVar32._8_4_ = fVar27 * auVar26._8_4_;
  auVar32._12_4_ = fVar27 * auVar26._12_4_;
  auVar24 = vsubps_avx(auVar24,auVar32);
  fVar23 = fVar23 - fVar28 * fVar27;
  auVar33._0_4_ = auVar24._0_4_ * auVar24._0_4_;
  auVar33._4_4_ = auVar24._4_4_ * auVar24._4_4_;
  auVar33._8_4_ = auVar24._8_4_ * auVar24._8_4_;
  auVar33._12_4_ = auVar24._12_4_ * auVar24._12_4_;
  fVar27 = fVar23 * fVar23;
  auVar25 = vhaddps_avx(auVar33,auVar33);
  auVar25 = ZEXT416((uint)(auVar25._0_4_ + fVar27));
  auVar25 = vsqrtss_avx(auVar25,auVar25);
  if (auVar25._0_4_ < 0.01) {
    uVar2._0_4_ = (this->objectTransform).value.value[2].field_0;
    uVar2._4_4_ = (this->objectTransform).value.value[2].field_1;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar2;
    fVar23 = (this->objectTransform).value.value[2].field_2.z;
    auVar34._0_4_ = auVar26._0_4_ * (float)(undefined4)uVar2;
    auVar34._4_4_ = auVar26._4_4_ * (float)uVar2._4_4_;
    auVar34._8_4_ = auVar26._8_4_ * 0.0;
    auVar34._12_4_ = auVar26._12_4_ * 0.0;
    auVar25 = vhaddps_avx(auVar34,auVar34);
    fVar27 = auVar25._0_4_ + fVar28 * fVar23;
    auVar35._0_4_ = fVar27 * auVar26._0_4_;
    auVar35._4_4_ = fVar27 * auVar26._4_4_;
    auVar35._8_4_ = fVar27 * auVar26._8_4_;
    auVar35._12_4_ = fVar27 * auVar26._12_4_;
    fVar23 = fVar23 - fVar28 * fVar27;
    auVar24 = vsubps_avx(auVar31,auVar35);
    fVar27 = fVar23 * fVar23;
  }
  auVar25 = vmovshdup_avx(auVar24);
  fVar29 = auVar24._0_4_;
  (this->objectTransform).value.value[0].field_0.x = auVar26._0_4_;
  fVar36 = auVar25._0_4_;
  auVar25 = ZEXT416((uint)(fVar29 * fVar29 + fVar36 * fVar36 + fVar27));
  auVar25 = vsqrtss_avx(auVar25,auVar25);
  fVar27 = 1.0 / auVar25._0_4_;
  fVar36 = fVar36 * fVar27;
  fVar23 = fVar23 * fVar27;
  fVar29 = fVar29 * fVar27;
  auVar25 = vmovshdup_avx(auVar26);
  (this->objectTransform).value.value[0].field_1.y = auVar25._0_4_;
  (this->objectTransform).value.value[0].field_2.z = fVar28;
  (this->objectTransform).value.value[0].field_3.w = 0.0;
  (this->objectTransform).value.value[1].field_0.x = fVar29;
  (this->objectTransform).value.value[1].field_1.y = fVar36;
  (this->objectTransform).value.value[1].field_2.z = fVar23;
  (this->objectTransform).value.value[1].field_3.w = 0.0;
  auVar24 = vfmsub231ss_fma(ZEXT416((uint)(fVar28 * fVar36)),ZEXT416((uint)fVar23),auVar25);
  auVar30 = vfmsub231ss_fma(ZEXT416((uint)(auVar26._0_4_ * fVar23)),ZEXT416((uint)fVar28),
                            ZEXT416((uint)fVar29));
  auVar25 = vfmsub231ss_fma(ZEXT416((uint)(auVar25._0_4_ * fVar29)),ZEXT416((uint)fVar36),auVar26);
  (this->objectTransform).value.value[2].field_0 = auVar24._0_4_;
  (this->objectTransform).value.value[2].field_1 = auVar30._0_4_;
  (this->objectTransform).value.value[2].field_2 = auVar25._0_4_;
  (this->objectTransform).value.value[2].field_3.w = 0.0;
  *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
   ((this->objectTransform).value.value + 3) = planePosition.field_0;
  fVar23 = (float)vextractps_avx(auVar21._0_16_,1);
  (this->objectTransform).value.value[3].field_1.y = fVar23;
  (this->objectTransform).value.value[3].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)planePosition.field_2;
  (this->objectTransform).value.value[3].field_3.w = 1.0;
  pmVar20 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&detail::persistentCache_glmmat4,&(this->objectTransform).name);
  aVar5 = (this->objectTransform).value.value[0].field_1;
  aVar6 = (this->objectTransform).value.value[0].field_2;
  aVar7 = (this->objectTransform).value.value[0].field_3;
  aVar8 = (this->objectTransform).value.value[1].field_0;
  aVar9 = (this->objectTransform).value.value[1].field_1;
  aVar10 = (this->objectTransform).value.value[1].field_2;
  aVar11 = (this->objectTransform).value.value[1].field_3;
  aVar12 = (this->objectTransform).value.value[2].field_0;
  aVar13 = (this->objectTransform).value.value[2].field_1;
  aVar14 = (this->objectTransform).value.value[2].field_2;
  aVar15 = (this->objectTransform).value.value[2].field_3;
  aVar16 = (this->objectTransform).value.value[3].field_0;
  aVar17 = (this->objectTransform).value.value[3].field_1;
  aVar18 = (this->objectTransform).value.value[3].field_2;
  aVar19 = (this->objectTransform).value.value[3].field_3;
  pmVar20->value[0].field_0 = (this->objectTransform).value.value[0].field_0;
  pmVar20->value[0].field_1 = aVar5;
  pmVar20->value[0].field_2 = aVar6;
  pmVar20->value[0].field_3 = aVar7;
  pmVar20->value[1].field_0 = aVar8;
  pmVar20->value[1].field_1 = aVar9;
  pmVar20->value[1].field_2 = aVar10;
  pmVar20->value[1].field_3 = aVar11;
  pmVar20->value[2].field_0 = aVar12;
  pmVar20->value[2].field_1 = aVar13;
  pmVar20->value[2].field_2 = aVar14;
  pmVar20->value[2].field_3 = aVar15;
  pmVar20->value[3].field_0 = aVar16;
  pmVar20->value[3].field_1 = aVar17;
  pmVar20->value[3].field_2 = aVar18;
  pmVar20->value[3].field_3 = aVar19;
  (this->objectTransform).holdsDefaultValue = false;
  requestRedraw();
  return;
}

Assistant:

void SlicePlane::setPose(glm::vec3 planePosition, glm::vec3 planeNormal) {

  // Choose the other axes to be most similar to the current ones, which will make animations look smoother
  // if the grid is shown
  glm::vec3 currBasisX{objectTransform.get()[1][0], objectTransform.get()[1][1], objectTransform.get()[1][2]};
  glm::vec3 currBasisY{objectTransform.get()[2][0], objectTransform.get()[2][1], objectTransform.get()[2][2]};

  glm::vec3 normal = glm::normalize(planeNormal);
  glm::vec3 basisX = currBasisX - normal * glm::dot(normal, currBasisX);
  if (glm::length(basisX) < 0.01) basisX = currBasisY - normal * glm::dot(normal, currBasisY);
  basisX = glm::normalize(basisX);
  glm::vec3 basisY = glm::cross(normal, basisX);

  // Build the rotation component
  glm::mat4x4 newTransform = glm::mat4x4(1.0);
  for (int i = 0; i < 3; i++) newTransform[0][i] = normal[i];
  for (int i = 0; i < 3; i++) newTransform[1][i] = basisX[i];
  for (int i = 0; i < 3; i++) newTransform[2][i] = basisY[i];

  // Build the translation component
  for (int i = 0; i < 3; i++) newTransform[3][i] = planePosition[i];

  objectTransform = newTransform;
  polyscope::requestRedraw();
}